

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O3

void __thiscall BamTools::Internal::BamToolsIndex::ReadBlock(BamToolsIndex *this,BtiBlock *block)

{
  IBamIODevice *pIVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  BamException *this_00;
  uint uVar6;
  string local_68;
  string local_48;
  
  pIVar1 = (this->m_resources).Device;
  iVar3 = (*pIVar1->_vptr_IBamIODevice[5])(pIVar1,block,4);
  pIVar1 = (this->m_resources).Device;
  iVar4 = (*pIVar1->_vptr_IBamIODevice[5])(pIVar1,&block->StartOffset,8);
  pIVar1 = (this->m_resources).Device;
  iVar5 = (*pIVar1->_vptr_IBamIODevice[5])(pIVar1,&block->StartPosition,4);
  if (this->m_isBigEndian == true) {
    uVar6 = block->MaxEndPosition;
    block->MaxEndPosition =
         uVar6 << 0x18 | (int)uVar6 >> 0x18 | (uVar6 & 0xff00) << 8 | uVar6 >> 8 & 0xff00;
    lVar2 = block->StartOffset;
    uVar6 = (uint)lVar2;
    block->StartOffset =
         lVar2 << 0x38 | lVar2 >> 0x38 | (ulong)(uVar6 & 0xff00) << 0x28 |
         (ulong)(uVar6 & 0xff000000) << 8 | (ulong)(uVar6 & 0xff0000) << 0x18 |
         (ulong)((uint)((ulong)lVar2 >> 0x28) & 0xff00 |
                (uint)((ulong)lVar2 >> 0x18) & 0xff0000 | (uint)((ulong)lVar2 >> 8) & 0xff000000);
    uVar6 = block->StartPosition;
    block->StartPosition =
         uVar6 << 0x18 | (int)uVar6 >> 0x18 | (uVar6 & 0xff00) << 8 | uVar6 >> 8 & 0xff00;
  }
  if (CONCAT44(extraout_var_01,iVar5) +
      CONCAT44(extraout_var_00,iVar4) + CONCAT44(extraout_var,iVar3) == 0x10) {
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"BamToolsIndex::ReadBlock","")
  ;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"could not read block","");
  BamException::BamException(this_00,&local_68,&local_48);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamToolsIndex::ReadBlock(BtiBlock& block)
{

    // read in block data members
    int64_t numBytesRead = 0;
    numBytesRead +=
        m_resources.Device->Read((char*)&block.MaxEndPosition, sizeof(block.MaxEndPosition));
    numBytesRead += m_resources.Device->Read((char*)&block.StartOffset, sizeof(block.StartOffset));
    numBytesRead +=
        m_resources.Device->Read((char*)&block.StartPosition, sizeof(block.StartPosition));

    // swap endian-ness if necessary
    if (m_isBigEndian) {
        SwapEndian_32(block.MaxEndPosition);
        SwapEndian_64(block.StartOffset);
        SwapEndian_32(block.StartPosition);
    }

    // check block read ok
    const int expectedBytes =
        sizeof(block.MaxEndPosition) + sizeof(block.StartOffset) + sizeof(block.StartPosition);
    if (numBytesRead != expectedBytes)
        throw BamException("BamToolsIndex::ReadBlock", "could not read block");
}